

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2configuration.cpp
# Opt level: O2

void __thiscall QHttp2Configuration::QHttp2Configuration(QHttp2Configuration *this)

{
  QHttp2ConfigurationPrivate *pQVar1;
  
  pQVar1 = (QHttp2ConfigurationPrivate *)operator_new(0x18);
  pQVar1->super_QSharedData = (QAtomicInt)0x0;
  pQVar1->sessionWindowSize = 0xffff;
  pQVar1->streamWindowSize = 0xffff;
  pQVar1->maxFrameSize = 0x4000;
  pQVar1->maxConcurrentStreams = 100;
  pQVar1->pushEnabled = false;
  pQVar1->huffmanCompressionEnabled = true;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QHttp2Configuration::QHttp2Configuration()
    : d(new QHttp2ConfigurationPrivate)
{
}